

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive_manifest.cpp
# Opt level: O2

ON_ComponentManifestItem * __thiscall
ON_ComponentManifest::PreviousItem(ON_ComponentManifest *this,ON_UUID manifest_item_id)

{
  ON_ComponentManifestItem_PRIVATE *pOVar1;
  ON_UUID local_10;
  
  local_10.Data4 = manifest_item_id.Data4;
  local_10._0_8_ = manifest_item_id._0_8_;
  if ((this->m_impl != (ON_ComponentManifestImpl *)0x0) &&
     (pOVar1 = ON_ComponentManifestImpl::ItemFromManifestId(this->m_impl,&local_10),
     pOVar1 != (ON_ComponentManifestItem_PRIVATE *)0x0)) {
    return &pOVar1->m_prev->super_ON_ComponentManifestItem;
  }
  return (ON_ComponentManifestItem *)0x0;
}

Assistant:

const class ON_ComponentManifestItem* ON_ComponentManifest::PreviousItem(
  ON_UUID manifest_item_id
  ) const
{
  const ON_ComponentManifestItem_PRIVATE* item
    = (nullptr != m_impl)
    ? m_impl->ItemFromManifestId(manifest_item_id)
    : nullptr;
  return
    (nullptr != item )
    ? item->m_prev
    : nullptr;
}